

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_xor(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint y;
  uint32_t uVar1;
  uint32_t s_1;
  uint32_t d_1;
  int i_1;
  uint32_t s;
  uint32_t d;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (s = 0; (int)s < length; s = s + 1) {
      uVar1 = INTERPOLATE_PIXEL(src[(int)s],(dest[(int)s] ^ 0xffffffff) >> 0x18,dest[(int)s],
                                (src[(int)s] ^ 0xffffffff) >> 0x18);
      dest[(int)s] = uVar1;
    }
  }
  else {
    for (s_1 = 0; (int)s_1 < length; s_1 = s_1 + 1) {
      y = dest[(int)s_1];
      uVar1 = BYTE_MUL(src[(int)s_1],const_alpha);
      uVar1 = INTERPOLATE_PIXEL(uVar1,(y ^ 0xffffffff) >> 0x18,y,(uVar1 ^ 0xffffffff) >> 0x18);
      dest[(int)s_1] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_xor(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = src[i];
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(~d), d, plutovg_alpha(~s));
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(~d), d, plutovg_alpha(~s));
        }
    }
}